

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode curl_easy_send(Curl_easy *data,void *buffer,size_t buflen,size_t *n)

{
  _Bool _Var1;
  connectdata *local_48;
  connectdata *c;
  ssize_t n1;
  CURLcode result;
  curl_socket_t sfd;
  size_t *n_local;
  size_t buflen_local;
  void *buffer_local;
  Curl_easy *data_local;
  
  local_48 = (connectdata *)0x0;
  _result = n;
  n_local = (size_t *)buflen;
  buflen_local = (size_t)buffer;
  buffer_local = data;
  _Var1 = Curl_is_in_callback(data);
  if (_Var1) {
    data_local._4_4_ = CURLE_RECURSIVE_API_CALL;
  }
  else {
    n1._0_4_ = easy_connection((Curl_easy *)buffer_local,(curl_socket_t *)((long)&n1 + 4),&local_48)
    ;
    data_local._4_4_ = (CURLcode)n1;
    if ((CURLcode)n1 == CURLE_OK) {
      *_result = 0;
      data_local._4_4_ =
           Curl_write(local_48,n1._4_4_,(void *)buflen_local,(size_t)n_local,(ssize_t *)&c);
      if (c == (connectdata *)0xffffffffffffffff) {
        data_local._4_4_ = CURLE_SEND_ERROR;
      }
      else if ((data_local._4_4_ == CURLE_OK) && (c == (connectdata *)0x0)) {
        data_local._4_4_ = CURLE_AGAIN;
      }
      else {
        *_result = (size_t)c;
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode curl_easy_send(struct Curl_easy *data, const void *buffer,
                        size_t buflen, size_t *n)
{
  curl_socket_t sfd;
  CURLcode result;
  ssize_t n1;
  struct connectdata *c = NULL;

  if(Curl_is_in_callback(data))
    return CURLE_RECURSIVE_API_CALL;

  result = easy_connection(data, &sfd, &c);
  if(result)
    return result;

  *n = 0;
  result = Curl_write(c, sfd, buffer, buflen, &n1);

  if(n1 == -1)
    return CURLE_SEND_ERROR;

  /* detect EAGAIN */
  if(!result && !n1)
    return CURLE_AGAIN;

  *n = (size_t)n1;

  return result;
}